

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDPublicKey.cpp
# Opt level: O3

void __thiscall OSSLEDPublicKey::setFromOSSL(OSSLEDPublicKey *this,EVP_PKEY *inPKEY)

{
  int iVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *puVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  ByteString raw;
  ByteString der;
  uchar *p;
  ByteString inEC;
  ByteString local_c8;
  ByteString local_a0;
  uchar *local_78;
  ByteString local_70;
  ByteString local_48;
  
  iVar1 = EVP_PKEY_get_id(inPKEY);
  this->nid = iVar1;
  if (iVar1 == 0) {
    return;
  }
  OSSL::oid2ByteString(&local_48,iVar1);
  EDPublicKey::setEC(&this->super_EDPublicKey,&local_48);
  uVar2 = i2d_PUBKEY((EVP_PKEY *)inPKEY,(uchar **)0x0);
  if ((int)uVar2 < 1) {
    softHSMLog(3,"setFromOSSL",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDPublicKey.cpp"
               ,0x77,"Could not encode EDDSA public key");
    goto LAB_00121601;
  }
  ByteString::ByteString(&local_a0);
  ByteString::resize(&local_a0,(ulong)uVar2);
  local_78 = ByteString::operator[](&local_a0,0);
  i2d_PUBKEY((EVP_PKEY *)inPKEY,&local_78);
  ByteString::ByteString(&local_c8);
  iVar1 = this->nid;
  if (iVar1 < 0x43f) {
    if (iVar1 == 0x40a) {
LAB_00121517:
      if (uVar2 == 0x2c) {
        ByteString::resize(&local_c8,0x20);
        puVar3 = ByteString::operator[](&local_c8,0);
        puVar4 = ByteString::operator[](&local_a0,0xc);
        uVar6 = *(undefined4 *)puVar4;
        uVar7 = *(undefined4 *)(puVar4 + 4);
        uVar8 = *(undefined4 *)(puVar4 + 8);
        uVar9 = *(undefined4 *)(puVar4 + 0xc);
        uVar10 = *(undefined4 *)(puVar4 + 0x10);
        uVar11 = *(undefined4 *)(puVar4 + 0x14);
        uVar12 = *(undefined4 *)(puVar4 + 0x18);
        uVar13 = *(undefined4 *)(puVar4 + 0x1c);
        goto LAB_00121550;
      }
      uVar5 = 0x2c;
      iVar1 = 0x84;
      goto LAB_001215b6;
    }
    if (iVar1 == 0x40b) {
      if (uVar2 != 0x44) {
        uVar5 = 0x44;
        iVar1 = 0x8d;
        goto LAB_001215b6;
      }
      ByteString::resize(&local_c8,0x38);
      puVar3 = ByteString::operator[](&local_c8,0);
      puVar4 = ByteString::operator[](&local_a0,0xc);
      *(undefined8 *)(puVar3 + 0x30) = *(undefined8 *)(puVar4 + 0x30);
      uVar6 = *(undefined4 *)puVar4;
      uVar7 = *(undefined4 *)(puVar4 + 4);
      uVar8 = *(undefined4 *)(puVar4 + 8);
      uVar9 = *(undefined4 *)(puVar4 + 0xc);
      uVar10 = *(undefined4 *)(puVar4 + 0x10);
      uVar11 = *(undefined4 *)(puVar4 + 0x14);
      uVar12 = *(undefined4 *)(puVar4 + 0x18);
      uVar13 = *(undefined4 *)(puVar4 + 0x1c);
      uVar14 = *(undefined4 *)(puVar4 + 0x20);
      uVar15 = *(undefined4 *)(puVar4 + 0x24);
      uVar16 = *(undefined4 *)(puVar4 + 0x28);
      uVar17 = *(undefined4 *)(puVar4 + 0x2c);
LAB_00121510:
      *(undefined4 *)(puVar3 + 0x20) = uVar14;
      *(undefined4 *)(puVar3 + 0x24) = uVar15;
      *(undefined4 *)(puVar3 + 0x28) = uVar16;
      *(undefined4 *)(puVar3 + 0x2c) = uVar17;
LAB_00121550:
      *(undefined4 *)(puVar3 + 0x10) = uVar10;
      *(undefined4 *)(puVar3 + 0x14) = uVar11;
      *(undefined4 *)(puVar3 + 0x18) = uVar12;
      *(undefined4 *)(puVar3 + 0x1c) = uVar13;
      *(undefined4 *)puVar3 = uVar6;
      *(undefined4 *)(puVar3 + 4) = uVar7;
      *(undefined4 *)(puVar3 + 8) = uVar8;
      *(undefined4 *)(puVar3 + 0xc) = uVar9;
      DERUTIL::raw2Octet(&local_70,&local_c8);
      (**(code **)(*(long *)&this->super_EDPublicKey + 0x40))(this,&local_70);
      local_70._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_70.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    }
  }
  else {
    if (iVar1 == 0x43f) goto LAB_00121517;
    if (iVar1 != 0x440) goto LAB_001215da;
    if (uVar2 == 0x45) {
      ByteString::resize(&local_c8,0x39);
      puVar3 = ByteString::operator[](&local_c8,0);
      puVar4 = ByteString::operator[](&local_a0,0xc);
      uVar6 = *(undefined4 *)puVar4;
      uVar7 = *(undefined4 *)(puVar4 + 4);
      uVar8 = *(undefined4 *)(puVar4 + 8);
      uVar9 = *(undefined4 *)(puVar4 + 0xc);
      uVar10 = *(undefined4 *)(puVar4 + 0x10);
      uVar11 = *(undefined4 *)(puVar4 + 0x14);
      uVar12 = *(undefined4 *)(puVar4 + 0x18);
      uVar13 = *(undefined4 *)(puVar4 + 0x1c);
      uVar14 = *(undefined4 *)(puVar4 + 0x20);
      uVar15 = *(undefined4 *)(puVar4 + 0x24);
      uVar16 = *(undefined4 *)(puVar4 + 0x28);
      uVar17 = *(undefined4 *)(puVar4 + 0x2c);
      uVar5 = *(undefined8 *)(puVar4 + 0x31);
      *(undefined8 *)(puVar3 + 0x29) = *(undefined8 *)(puVar4 + 0x29);
      *(undefined8 *)(puVar3 + 0x31) = uVar5;
      goto LAB_00121510;
    }
    uVar5 = 0x45;
    iVar1 = 0x97;
LAB_001215b6:
    softHSMLog(3,"setFromOSSL",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDPublicKey.cpp"
               ,iVar1,"Invalid size. Expected: %lu, Actual: %lu",uVar5,uVar2);
  }
LAB_001215da:
  local_c8._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_c8.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_a0._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_a0.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
LAB_00121601:
  local_48._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_48.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return;
}

Assistant:

void OSSLEDPublicKey::setFromOSSL(const EVP_PKEY* inPKEY)
{
	nid = EVP_PKEY_id(inPKEY);
	if (nid == NID_undef)
	{
		return;
	}
	ByteString inEC = OSSL::oid2ByteString(nid);
	EDPublicKey::setEC(inEC);

	// i2d_PUBKEY incorrectly does not const the key argument?!
        EVP_PKEY* key = const_cast<EVP_PKEY*>(inPKEY);
	int len = i2d_PUBKEY(key, NULL);
	if (len <= 0)
	{
		ERROR_MSG("Could not encode EDDSA public key");
		return;
	}
	ByteString der;
	der.resize(len);
	unsigned char *p = &der[0];
	i2d_PUBKEY(key, &p);
	ByteString raw;
	switch (nid) {
	case NID_X25519:
	case NID_ED25519:
		if (len != (X25519_KEYLEN + PREFIXLEN))
		{
			ERROR_MSG("Invalid size. Expected: %lu, Actual: %lu", X25519_KEYLEN + PREFIXLEN, len);
			return;
		}
		raw.resize(X25519_KEYLEN);
		memcpy(&raw[0], &der[PREFIXLEN], X25519_KEYLEN);
		break;
	case NID_X448:
		if (len != (X448_KEYLEN + PREFIXLEN))
		{
			ERROR_MSG("Invalid size. Expected: %lu, Actual: %lu", X448_KEYLEN + PREFIXLEN, len);
			return;
		}
		raw.resize(X448_KEYLEN);
		memcpy(&raw[0], &der[PREFIXLEN], X448_KEYLEN);
		break;
	case NID_ED448:
		if (len != (ED448_KEYLEN + PREFIXLEN))
		{
			ERROR_MSG("Invalid size. Expected: %lu, Actual: %lu",
				  ED448_KEYLEN + PREFIXLEN, len);
			return;
		}
		raw.resize(ED448_KEYLEN);
		memcpy(&raw[0], &der[PREFIXLEN], ED448_KEYLEN);
		break;
	default:
		return;
	}
	setA(DERUTIL::raw2Octet(raw));
}